

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

date_time * __thiscall
booster::locale::date_time::operator-=(date_time *this,date_time_period_set *v)

{
  ulong uVar1;
  size_t sVar2;
  date_time *in_RSI;
  date_time *in_RDI;
  date_time_period_set *in_stack_00000008;
  uint i;
  size_t in_stack_00000030;
  date_time_period_set *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    uVar1 = (ulong)uVar3;
    sVar2 = date_time_period_set::size(in_stack_00000008);
    if (sVar2 <= uVar1) break;
    date_time_period_set::operator[](in_stack_00000038,in_stack_00000030);
    operator-=(in_RSI,(date_time_period *)CONCAT44(uVar3,in_stack_ffffffffffffffe8));
    uVar3 = uVar3 + 1;
  }
  return in_RDI;
}

Assistant:

date_time const &date_time::operator-=(date_time_period_set const &v) 
{
    for(unsigned i=0;i<v.size();i++) {
        *this-=v[i];
    }
    return *this;
}